

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O1

CURLcode Curl_ntlm_core_mk_nt_hash(Curl_easy *data,char *password,uchar *ntbuffer)

{
  size_t sVar1;
  curl_malloc_callback *pp_Var2;
  char *pcVar3;
  size_t sVar4;
  CURLcode CVar5;
  MD4_CTX MD4pw;
  MD4_CTX local_84;
  
  sVar1 = strlen(password);
  CVar5 = CURLE_OUT_OF_MEMORY;
  if (-1 < (long)sVar1) {
    if (sVar1 == 0) {
      pcVar3 = "";
      pp_Var2 = (curl_malloc_callback *)&Curl_cstrdup;
    }
    else {
      pp_Var2 = &Curl_cmalloc;
      pcVar3 = (char *)(sVar1 * 2);
    }
    pcVar3 = (**pp_Var2)(pcVar3);
    if (pcVar3 != (char *)0x0) {
      if (sVar1 != 0) {
        sVar4 = 0;
        do {
          pcVar3[sVar4 * 2] = password[sVar4];
          pcVar3[sVar4 * 2 + 1] = '\0';
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
      }
      MD4_Init(&local_84);
      MD4_Update(&local_84,pcVar3,sVar1 * 2);
      MD4_Final(ntbuffer,&local_84);
      ntbuffer[0x10] = '\0';
      ntbuffer[0x11] = '\0';
      ntbuffer[0x12] = '\0';
      ntbuffer[0x13] = '\0';
      ntbuffer[0x14] = '\0';
      (*Curl_cfree)(pcVar3);
      CVar5 = CURLE_OK;
    }
  }
  return CVar5;
}

Assistant:

CURLcode Curl_ntlm_core_mk_nt_hash(struct Curl_easy *data,
                                   const char *password,
                                   unsigned char *ntbuffer /* 21 bytes */)
{
  size_t len = strlen(password);
  unsigned char *pw;
  CURLcode result;
  if(len > SIZE_T_MAX/2) /* avoid integer overflow */
    return CURLE_OUT_OF_MEMORY;
  pw = len ? malloc(len * 2) : strdup("");
  if(!pw)
    return CURLE_OUT_OF_MEMORY;

  ascii_to_unicode_le(pw, password, len);

  /*
   * The NT hashed password needs to be created using the password in the
   * network encoding not the host encoding.
   */
  result = Curl_convert_to_network(data, (char *)pw, len * 2);
  if(result)
    return result;

  {
    /* Create NT hashed password. */
#ifdef USE_OPENSSL
#if !defined(OPENSSL_NO_MD4)
    MD4_CTX MD4pw;
    MD4_Init(&MD4pw);
    MD4_Update(&MD4pw, pw, 2 * len);
    MD4_Final(ntbuffer, &MD4pw);
#else
    Curl_md4it(ntbuffer, pw, 2 * len);
#endif
#elif defined(USE_GNUTLS_NETTLE)
    struct md4_ctx MD4pw;
    md4_init(&MD4pw);
    md4_update(&MD4pw, (unsigned int)(2 * len), pw);
    md4_digest(&MD4pw, MD4_DIGEST_SIZE, ntbuffer);
#elif defined(USE_GNUTLS)
    gcry_md_hd_t MD4pw;
    gcry_md_open(&MD4pw, GCRY_MD_MD4, 0);
    gcry_md_write(MD4pw, pw, 2 * len);
    memcpy(ntbuffer, gcry_md_read(MD4pw, 0), MD4_DIGEST_LENGTH);
    gcry_md_close(MD4pw);
#elif defined(USE_NSS)
    Curl_md4it(ntbuffer, pw, 2 * len);
#elif defined(USE_MBEDTLS)
#if defined(MBEDTLS_MD4_C)
    mbedtls_md4(pw, 2 * len, ntbuffer);
#else
    Curl_md4it(ntbuffer, pw, 2 * len);
#endif
#elif defined(USE_SECTRANSP)
    (void)CC_MD4(pw, (CC_LONG)(2 * len), ntbuffer);
#elif defined(USE_OS400CRYPTO)
    Curl_md4it(ntbuffer, pw, 2 * len);
#elif defined(USE_WIN32_CRYPTO)
    HCRYPTPROV hprov;
    if(CryptAcquireContext(&hprov, NULL, NULL, PROV_RSA_FULL,
                           CRYPT_VERIFYCONTEXT)) {
      HCRYPTHASH hhash;
      if(CryptCreateHash(hprov, CALG_MD4, 0, 0, &hhash)) {
        DWORD length = 16;
        CryptHashData(hhash, pw, (unsigned int)len * 2, 0);
        CryptGetHashParam(hhash, HP_HASHVAL, ntbuffer, &length, 0);
        CryptDestroyHash(hhash);
      }
      CryptReleaseContext(hprov, 0);
    }
#endif

    memset(ntbuffer + 16, 0, 21 - 16);
  }

  free(pw);

  return CURLE_OK;
}